

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void jsonGroupInverse(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  ulong uVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  byte bVar8;
  bool bVar9;
  bool bVar10;
  
  if ((short)ctx->pMem->flags < 0) {
    pcVar4 = ctx->pMem->z;
  }
  else {
    pcVar4 = (char *)createAggContext(ctx,0);
  }
  if (pcVar4 != (char *)0x0) {
    uVar1 = *(ulong *)(pcVar4 + 0x18);
    bVar10 = 1 < uVar1;
    if (bVar10) {
      lVar2 = *(long *)(pcVar4 + 8);
      bVar8 = *(byte *)(lVar2 + 1);
      if (bVar8 == 0x2c) {
        uVar7 = 2;
        uVar5 = 1;
      }
      else {
        uVar5 = 1;
        bVar9 = false;
        iVar6 = 0;
        do {
          iVar3 = (int)uVar5;
          if (bVar8 == 0x5c) {
            iVar3 = iVar3 + 1;
          }
          else if (bVar8 == 0x22) {
            bVar9 = (bool)(~bVar9 & 1);
          }
          else {
            bVar10 = !bVar9;
            bVar9 = true;
            if (bVar10) {
              iVar6 = (iVar6 + (uint)((bVar8 & 0xdf) == 0x5b)) - (uint)((bVar8 & 0xdf) == 0x5d);
              bVar9 = false;
            }
          }
          uVar5 = (ulong)(iVar3 + 1);
          bVar10 = uVar5 < uVar1;
          if (uVar1 <= uVar5) goto LAB_001be0e8;
          bVar8 = *(byte *)(lVar2 + uVar5);
        } while (((bVar8 != 0x2c) || (bVar9)) || (iVar6 != 0));
        uVar7 = (ulong)(iVar3 + 2);
      }
      if (bVar10) {
        *(ulong *)(pcVar4 + 0x18) = uVar1 - uVar5;
        memmove((void *)(lVar2 + 1),(void *)(uVar7 + lVar2),(uVar1 - uVar5) - 1);
        *(undefined1 *)(lVar2 + *(long *)(pcVar4 + 0x18)) = 0;
        return;
      }
    }
LAB_001be0e8:
    pcVar4[0x18] = '\x01';
    pcVar4[0x19] = '\0';
    pcVar4[0x1a] = '\0';
    pcVar4[0x1b] = '\0';
    pcVar4[0x1c] = '\0';
    pcVar4[0x1d] = '\0';
    pcVar4[0x1e] = '\0';
    pcVar4[0x1f] = '\0';
  }
  return;
}

Assistant:

static void jsonGroupInverse(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  unsigned int i;
  int inStr = 0;
  int nNest = 0;
  char *z;
  char c;
  JsonString *pStr;
  UNUSED_PARAMETER(argc);
  UNUSED_PARAMETER(argv);
  pStr = (JsonString*)sqlite3_aggregate_context(ctx, 0);
#ifdef NEVER
  /* pStr is always non-NULL since jsonArrayStep() or jsonObjectStep() will
  ** always have been called to initalize it */
  if( NEVER(!pStr) ) return;
#endif
  z = pStr->zBuf;
  for(i=1; i<pStr->nUsed && ((c = z[i])!=',' || inStr || nNest); i++){
    if( c=='"' ){
      inStr = !inStr;
    }else if( c=='\\' ){
      i++;
    }else if( !inStr ){
      if( c=='{' || c=='[' ) nNest++;
      if( c=='}' || c==']' ) nNest--;
    }
  }
  if( i<pStr->nUsed ){
    pStr->nUsed -= i;
    memmove(&z[1], &z[i+1], (size_t)pStr->nUsed-1);
    z[pStr->nUsed] = 0;
  }else{
    pStr->nUsed = 1;
  }
}